

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O2

void __thiscall MetaSim::Simulation::clearEventQueue(Simulation *this)

{
  Event *this_00;
  
  while ((Event::_eventQueue._40_8_ != 0 &&
         (this_00 = *(Event **)(Event::_eventQueue._24_8_ + 0x20), this_00 != (Event *)0x0))) {
    Event::drop(this_00);
    if (this_00->_disposable == true) {
      (*this_00->_vptr_Event[1])(this_00);
    }
  }
  (this->globTime).v = 0;
  return;
}

Assistant:

void Simulation::clearEventQueue()
    {
        Event *temp;
        while ((temp = Event::getFirst()) != NULL) {
            temp->drop();
            if (temp->isDisposable()) // if it has to be deleted...
                delete temp;                 
        }
        globTime = 0;
    }